

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O2

int __thiscall Clasp::PropagatorList::remove(PropagatorList *this,char *__filename)

{
  PropagatorList PVar1;
  int in_EAX;
  PostPropagator **ppPVar2;
  
  if (__filename == (char *)0x0) {
    Potassco::fail(-2,"void Clasp::PropagatorList::remove(PostPropagator *)",0x55,"p",
                   "Invalid post propagator",0);
  }
  do {
    ppPVar2 = &this->head_;
    PVar1.head_ = *ppPVar2;
    if (PVar1.head_ == (PostPropagator *)0x0) {
      return in_EAX;
    }
    this = (PropagatorList *)&(PVar1.head_)->next;
  } while (PVar1.head_ != (PostPropagator *)__filename);
  *ppPVar2 = (PVar1.head_)->next;
  __filename[8] = '\0';
  __filename[9] = '\0';
  __filename[10] = '\0';
  __filename[0xb] = '\0';
  __filename[0xc] = '\0';
  __filename[0xd] = '\0';
  __filename[0xe] = '\0';
  __filename[0xf] = '\0';
  return in_EAX;
}

Assistant:

void PropagatorList::remove(PostPropagator* p) {
	POTASSCO_REQUIRE(p, "Invalid post propagator");
	for (PostPropagator** r = head(), *x; *r; r = &x->next) {
		if ((x = *r) == p) {
			*r      = x->next;
			p->next = 0;
			break;
		}
	}
}